

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::fileOrderComparator(TestCase *lhs,TestCase *rhs)

{
  int iVar1;
  int res;
  TestCase *rhs_local;
  TestCase *lhs_local;
  
  iVar1 = String::compare((String *)lhs,(String *)rhs,false);
  if (iVar1 == 0) {
    if ((lhs->super_TestCaseData).m_line == (rhs->super_TestCaseData).m_line) {
      lhs_local._7_1_ = lhs->m_template_id < rhs->m_template_id;
    }
    else {
      lhs_local._7_1_ = (lhs->super_TestCaseData).m_line < (rhs->super_TestCaseData).m_line;
    }
  }
  else {
    lhs_local._7_1_ = iVar1 < 0;
  }
  return lhs_local._7_1_;
}

Assistant:

bool fileOrderComparator(const TestCase* lhs, const TestCase* rhs) {
        // this is needed because MSVC gives different case for drive letters
        // for __FILE__ when evaluated in a header and a source file
        const int res = lhs->m_file.compare(rhs->m_file, bool(DOCTEST_MSVC));
        if(res != 0)
            return res < 0;
        if(lhs->m_line != rhs->m_line)
            return lhs->m_line < rhs->m_line;
        return lhs->m_template_id < rhs->m_template_id;
    }